

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::QueryManagerVk::QueryPoolInfo::Init
          (QueryPoolInfo *this,VulkanLogicalDevice *LogicalDevice,VkQueryPoolCreateInfo *QueryPoolCI
          ,QUERY_TYPE Type)

{
  reference pvVar1;
  uint local_44;
  undefined1 local_40 [4];
  Uint32 i;
  QUERY_TYPE local_24;
  VkQueryPoolCreateInfo *pVStack_20;
  QUERY_TYPE Type_local;
  VkQueryPoolCreateInfo *QueryPoolCI_local;
  VulkanLogicalDevice *LogicalDevice_local;
  QueryPoolInfo *this_local;
  
  this->m_Type = Type;
  this->m_QueryCount = QueryPoolCI->queryCount;
  local_24 = Type;
  pVStack_20 = QueryPoolCI;
  QueryPoolCI_local = (VkQueryPoolCreateInfo *)LogicalDevice;
  LogicalDevice_local = (VulkanLogicalDevice *)this;
  VulkanUtilities::VulkanLogicalDevice::CreateQueryPool
            ((QueryPoolWrapper *)local_40,LogicalDevice,QueryPoolCI,"QueryManagerVk: query pool");
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  operator=(&this->m_vkQueryPool,
            (VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *)
            local_40);
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *)
             local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_StaleQueries,(ulong)this->m_QueryCount);
  for (local_44 = 0; local_44 < this->m_QueryCount; local_44 = local_44 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_StaleQueries,(ulong)local_44);
    *pvVar1 = local_44;
  }
  return;
}

Assistant:

void QueryManagerVk::QueryPoolInfo::Init(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                         const VkQueryPoolCreateInfo&                QueryPoolCI,
                                         QUERY_TYPE                                  Type)
{
    m_Type        = Type;
    m_QueryCount  = QueryPoolCI.queryCount;
    m_vkQueryPool = LogicalDevice.CreateQueryPool(QueryPoolCI, "QueryManagerVk: query pool");

    m_StaleQueries.resize(m_QueryCount);
    for (Uint32 i = 0; i < m_QueryCount; ++i)
        m_StaleQueries[i] = i;
}